

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadGLZSegs(FileReaderBase *data,int type)

{
  line_t *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  seg_t *psVar4;
  side_t *psVar5;
  sector_t *psVar6;
  line_t *plVar7;
  vertex_t *pvVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  size_t j;
  ulong uVar12;
  BYTE side;
  WORD lineword;
  DWORD line;
  DWORD partner;
  DWORD v1;
  long local_38;
  
  lVar10 = 0;
  while (lVar10 < numsubsectors) {
    lVar11 = 0;
    local_38 = lVar10;
    for (uVar12 = 0; uVar12 < subsectors[lVar10].numlines; uVar12 = uVar12 + 1) {
      (*data->_vptr_FileReaderBase[2])(data,&v1,4);
      (*data->_vptr_FileReaderBase[2])(data,&partner,4);
      if (type < 2) {
        (*data->_vptr_FileReaderBase[2])(data,&lineword,2);
        line = (uint)lineword;
        if (lineword == 0xffff) {
          line = 0xffffffff;
        }
      }
      else {
        (*data->_vptr_FileReaderBase[2])(data,&line,4);
      }
      (*data->_vptr_FileReaderBase[2])(data,&side,1);
      psVar4 = subsectors[lVar10].firstline;
      pvVar8 = vertexes + v1;
      *(vertex_t **)((long)&psVar4->v1 + lVar11) = pvVar8;
      if (lVar11 == 0) {
        uVar9 = (ulong)(subsectors[lVar10].numlines - 1);
      }
      else {
        uVar9 = uVar12 - 1;
      }
      psVar4[uVar9].v2 = pvVar8;
      glsegextras[((long)psVar4 + (lVar11 - (long)segs)) / 0x48].PartnerSeg = partner;
      plVar7 = lines;
      uVar9 = (ulong)line;
      if (uVar9 == 0xffffffff) {
        puVar2 = (undefined8 *)((long)&psVar4->sidedef + lVar11);
        *puVar2 = 0;
        puVar2[1] = 0;
        psVar6 = (subsectors[lVar10].firstline)->frontsector;
        *(sector_t **)((long)&psVar4->backsector + lVar11) = psVar6;
        *(sector_t **)((long)&psVar4->frontsector + lVar11) = psVar6;
      }
      else {
        plVar1 = lines + uVar9;
        *(line_t **)((long)&psVar4->linedef + lVar11) = plVar1;
        psVar5 = plVar1->sidedef[side];
        *(side_t **)((long)&psVar4->sidedef + lVar11) = psVar5;
        *(sector_t **)((long)&psVar4->frontsector + lVar11) = psVar5->sector;
        uVar3 = plVar7[uVar9].flags;
        if (((uVar3 & 4) == 0) || (plVar1->sidedef[side ^ 1] == (side_t *)0x0)) {
          *(undefined8 *)((long)&psVar4->backsector + lVar11) = 0;
          plVar1->flags = uVar3 & 0xfffffffb;
        }
        else {
          *(sector_t **)((long)&psVar4->backsector + lVar11) = plVar1->sidedef[side ^ 1]->sector;
        }
      }
      lVar11 = lVar11 + 0x48;
    }
    lVar10 = local_38 + 1;
  }
  return;
}

Assistant:

void P_LoadGLZSegs (FileReaderBase &data, int type)
{
	for (int i = 0; i < numsubsectors; ++i)
	{
		for (size_t j = 0; j < subsectors[i].numlines; ++j)
		{
			seg_t *seg;
			DWORD v1, partner;
			DWORD line;
			WORD lineword;
			BYTE side;

			data >> v1 >> partner;
			if (type >= 2)
			{
				data >> line;
			}
			else
			{
				data >> lineword;
				line = lineword == 0xFFFF ? 0xFFFFFFFF : lineword;
			}
			data >> side;

			seg = subsectors[i].firstline + j;
			seg->v1 = &vertexes[v1];
			if (j == 0)
			{
				seg[subsectors[i].numlines - 1].v2 = seg->v1;
			}
			else
			{
				seg[-1].v2 = seg->v1;
			}
			glsegextras[seg - segs].PartnerSeg = partner;
			if (line != 0xFFFFFFFF)
			{
				line_t *ldef;

				seg->linedef = ldef = &lines[line];
				seg->sidedef = ldef->sidedef[side];
				seg->frontsector = ldef->sidedef[side]->sector;
				if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
				{
					seg->backsector = ldef->sidedef[side^1]->sector;
				}
				else
				{
					seg->backsector = 0;
					ldef->flags &= ~ML_TWOSIDED;
				}
			}
			else
			{
				seg->linedef = NULL;
				seg->sidedef = NULL;
				seg->frontsector = seg->backsector = subsectors[i].firstline->frontsector;
			}
		}
	}
}